

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall libcellml::Model::removeAllUnits(Model *this)

{
  EntityImpl *pEVar1;
  undefined8 *puVar2;
  UnitsImpl *this_00;
  shared_ptr<libcellml::Units> *u;
  undefined8 *puVar3;
  
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  puVar2 = (undefined8 *)pEVar1[4].mId.field_2._M_allocated_capacity;
  for (puVar3 = (undefined8 *)pEVar1[4].mId._M_string_length; puVar3 != puVar2; puVar3 = puVar3 + 2)
  {
    this_00 = Units::pFunc((Units *)*puVar3);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
  }
  std::
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
  clear((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
         *)&(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
            [4].mId._M_string_length);
  return;
}

Assistant:

void Model::removeAllUnits()
{
    for (const auto &u : pFunc()->mUnits) {
        u->pFunc()->removeParent();
    }
    pFunc()->mUnits.clear();
}